

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

wal_item * wal_itr_search_greater(wal_iterator *wal_itr,wal_item *query)

{
  avl_node *paVar1;
  avl_tree *in_RSI;
  wal_item *in_RDI;
  avl_node *a;
  wal_item *local_30;
  avl_cmp_func *in_stack_ffffffffffffffd8;
  avl_node *in_stack_ffffffffffffffe0;
  wal_iterator *in_stack_fffffffffffffff8;
  
  if (((ulong)(in_RDI->list_elem).next[3].prev & 0x1000000) == 0) {
    if ((in_RDI->list_elem).next[2].prev == (list_elem *)0x0) {
      local_30 = (wal_item *)0x0;
    }
    else {
      *(undefined1 *)((long)&(in_RDI->avl_seq).right + 2) = 1;
      if (((ulong)(in_RDI->avl_seq).right & 1) == 0) {
        local_30 = _wal_itr_search_greater_byseq(in_stack_fffffffffffffff8,in_RDI);
      }
      else {
        local_30 = _wal_itr_search_greater_bykey(in_stack_fffffffffffffff8,in_RDI);
      }
    }
  }
  else if (((ulong)(in_RDI->avl_seq).right & 1) == 0) {
    paVar1 = avl_search_greater(in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    in_RDI->txn_id = (uint64_t)paVar1;
    if (paVar1 == (avl_node *)0x0) {
      local_30 = (wal_item *)0x0;
    }
    else {
      local_30 = (wal_item *)&paVar1[-1].left;
    }
  }
  else {
    paVar1 = avl_search_greater(in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    in_RDI->txn_id = (uint64_t)paVar1;
    if (paVar1 == (avl_node *)0x0) {
      local_30 = (wal_item *)0x0;
    }
    else {
      local_30 = (wal_item *)&paVar1[-5].right;
    }
  }
  return local_30;
}

Assistant:

struct wal_item* wal_itr_search_greater(struct wal_iterator *wal_itr,
                                        struct wal_item *query)
{
    if (wal_itr->shandle->is_persisted_snapshot) {
        struct avl_node *a;
        if (wal_itr->by_key) {
            a = avl_search_greater(&wal_itr->shandle->key_tree,
                                   &query->avl_keysnap,
                                   _snap_cmp_bykey);
            wal_itr->cursor_pos = a;
            return a ? _get_entry(a, struct wal_item, avl_keysnap) : NULL;
        } else {
            a = avl_search_greater(&wal_itr->shandle->seq_tree,
                                   &query->avl_seq,
                                   _wal_cmp_byseq);
            wal_itr->cursor_pos = a;
            return a ? _get_entry(a, struct wal_item, avl_seq) : NULL;
        }
    }
    if (wal_itr->shandle->snap_tag_idx) {
        wal_itr->direction = FDB_ITR_FORWARD;
        if (wal_itr->by_key) {
            return _wal_itr_search_greater_bykey(wal_itr, query);
        } else {
            return _wal_itr_search_greater_byseq(wal_itr, query);
        }
    } // else no items in WAL in snapshot..
    return NULL;
}